

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report.cpp
# Opt level: O3

void __thiscall
sc_core::sc_report::sc_report
          (sc_report *this,sc_severity severity_,sc_msg_def *md_,char *msg_,char *file_,int line_,
          int verbosity_level)

{
  sc_process_b *psVar1;
  size_t sVar2;
  sc_time *psVar3;
  sc_time *psVar4;
  sc_simcontext *this_00;
  sc_report *extraout_RDX;
  sc_report *extraout_RDX_00;
  sc_report *extraout_RDX_01;
  sc_report *extraout_RDX_02;
  sc_report *rep;
  ulong uVar5;
  char *pcVar6;
  char *pcVar7;
  string local_50;
  
  *(undefined ***)this = &PTR__sc_report_0026ee90;
  this->severity = severity_;
  this->md = md_;
  pcVar7 = &empty_str;
  pcVar6 = &empty_str;
  if ((msg_ != (char *)0x0) && (pcVar6 = &empty_str, *msg_ != '\0')) {
    sVar2 = strlen(msg_);
    uVar5 = sVar2 + 1;
    pcVar6 = (char *)operator_new__(uVar5);
    if (uVar5 != 0) {
      memcpy(pcVar6,msg_,uVar5);
    }
  }
  this->msg = pcVar6;
  if ((file_ != (char *)0x0) && (*file_ != '\0')) {
    sVar2 = strlen(file_);
    uVar5 = sVar2 + 1;
    pcVar7 = (char *)operator_new__(uVar5);
    if (uVar5 != 0) {
      memcpy(pcVar7,file_,uVar5);
    }
  }
  this->file = pcVar7;
  this->line = line_;
  psVar3 = (sc_time *)operator_new(8);
  psVar4 = sc_time_stamp();
  psVar3->m_value = psVar4->m_value;
  this->timestamp = psVar3;
  rep = extraout_RDX;
  if (sc_curr_simcontext == (sc_simcontext *)0x0) {
    this_00 = (sc_simcontext *)operator_new(0x168);
    sc_simcontext::sc_simcontext(this_00);
    rep = extraout_RDX_00;
    sc_curr_simcontext = this_00;
    sc_default_global_context = this_00;
  }
  psVar1 = (sc_curr_simcontext->m_curr_proc_info).process_handle;
  pcVar6 = &empty_str;
  if (((psVar1 != (sc_process_b *)0x0) &&
      (pcVar7 = (psVar1->super_sc_object).m_name._M_dataplus._M_p, pcVar7 != (char *)0x0)) &&
     (*pcVar7 != '\0')) {
    sVar2 = strlen(pcVar7);
    uVar5 = sVar2 + 1;
    pcVar6 = (char *)operator_new__(uVar5);
    rep = extraout_RDX_01;
    if (uVar5 != 0) {
      memcpy(pcVar6,pcVar7,uVar5);
      rep = extraout_RDX_02;
    }
  }
  this->process_name = pcVar6;
  this->m_verbosity_level = verbosity_level;
  sc_report_compose_message_abi_cxx11_(&local_50,(sc_core *)this,rep);
  pcVar6 = &empty_str;
  if ((local_50._M_dataplus._M_p != (char *)0x0) && (*local_50._M_dataplus._M_p != '\0')) {
    sVar2 = strlen(local_50._M_dataplus._M_p);
    uVar5 = sVar2 + 1;
    pcVar6 = (char *)operator_new__(uVar5);
    if (uVar5 != 0) {
      memcpy(pcVar6,local_50._M_dataplus._M_p,uVar5);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this->m_what = pcVar6;
  return;
}

Assistant:

sc_report::sc_report(sc_severity severity_,
		     const sc_msg_def* md_,
		     const char* msg_,
		     const char* file_,
		     int line_,
		     int verbosity_level)
: severity(severity_),
  md(md_),
  msg(empty_dup(msg_)),
  file(empty_dup(file_)),
  line(line_),
  timestamp(new sc_time(sc_time_stamp())),
  process_name(empty_dup(sc_get_current_process_name())),
  m_verbosity_level(verbosity_level),
  m_what( empty_dup( sc_report_compose_message(*this).c_str() ) )
{
}